

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O3

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits,bool val)

{
  uint *puVar1;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var2;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    uVar7 = 0;
    if (bits == 0) {
      return;
    }
  }
  else {
    uVar7 = *(uint *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    if (uVar7 == bits) {
      return;
    }
  }
  resize(this,bits);
  _Var3._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (uint *)0x0) {
    if (-1 < (int)uVar7) {
      return;
    }
    iVar4 = 0;
  }
  else {
    uVar6 = *_Var3._M_head_impl;
    if ((int)uVar6 <= (int)uVar7) {
      return;
    }
    iVar4 = uVar6 + 0x3e;
    if (-1 < (int)(uVar6 + 0x1f)) {
      iVar4 = uVar6 + 0x1f;
    }
    iVar4 = iVar4 >> 5;
  }
  iVar5 = uVar7 + 0x3e;
  if (-1 < (int)(uVar7 + 0x1f)) {
    iVar5 = uVar7 + 0x1f;
  }
  iVar5 = iVar5 >> 5;
  if (val) {
    if ((uVar7 & 0x1f) != 0 && uVar7 - 1 < 0xffffffc1) {
      uVar7 = 0xffffffff >> (sbyte)(uVar7 & 0x1f);
      puVar1 = _Var3._M_head_impl + (long)iVar5 * 4;
      *puVar1 = *puVar1 | uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18;
    }
    if (iVar4 - iVar5 != 0 && iVar5 <= iVar4) {
      memset(_Var3._M_head_impl + (long)iVar5 * 4 + 1,0xff,(long)(iVar4 - iVar5) << 2);
      _Var3._M_head_impl =
           (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t
           .super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    }
    if (_Var3._M_head_impl != (uint *)0x0) {
      uVar7 = *_Var3._M_head_impl;
      if ((uVar7 & 0x1f) != 0) {
        uVar6 = -1 << (-(char)(uVar7 & 0x1f) & 0x1fU);
        iVar4 = uVar7 + 0x3e;
        if (-1 < (int)(uVar7 + 0x1f)) {
          iVar4 = uVar7 + 0x1f;
        }
        _Var3._M_head_impl[iVar4 >> 5] =
             _Var3._M_head_impl[iVar4 >> 5] &
             (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
      }
    }
  }
  else if (iVar4 - iVar5 != 0 && iVar5 <= iVar4) {
    memset(_Var3._M_head_impl + (long)iVar5 * 4 + 1,0,(long)(iVar4 - iVar5) << 2);
    return;
  }
  return;
}

Assistant:

void bitfield::resize(int const bits, bool const val)
	{
		if (bits == size()) return;

		int const s = size();
		int const b = size() & 31;
		resize(bits);
		if (s >= size()) return;
		int const old_size_words = (s + 31) / 32;
		int const new_size_words = num_words();
		if (val)
		{
			if (old_size_words && b) buf()[old_size_words - 1] |= aux::host_to_network(0xffffffff >> b);
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0xff
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
			clear_trailing_bits();
		}
		else
		{
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0x00
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
		}
		TORRENT_ASSERT(size() == bits);
	}